

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadStoreLane
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          SIMDLoadStoreLane *curr)

{
  Name memory;
  undefined1 this_00 [8];
  char cVar1;
  Index bytes;
  int iVar2;
  Address AVar3;
  undefined4 extraout_var;
  long lVar4;
  Literal aLStack_468 [15];
  undefined1 local_300 [8];
  array<wasm::Literal,_16UL> lanes;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  undefined1 local_108 [8];
  Flow ptrFlow;
  Flow vecFlow;
  Literal vec;
  undefined1 local_48 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_108,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             *(Expression **)(curr + 0x30));
  if (ptrFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ptrFlow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,*(Expression **)(curr + 0x38));
    if (vecFlow.breakTo.super_IString.str._M_len == 0) {
      getMemoryInstanceInfo((MemoryInstanceInfo *)local_48,this,(Name)*(string_view *)(curr + 0x40))
      ;
      memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memory.super_IString.str._M_len = (size_t)info.instance;
      AVar3 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_48,memory);
      this_00 = local_48;
      if (((long)((long)ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
          3) * -0x5555555555555555 + (long)local_108 != 1) {
LAB_0012e824:
        __assert_fail("values.size() == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x52,"const Literal &wasm::Flow::getSingleValue()");
      }
      wasm::Literal::Literal((Literal *)&lanes._M_elems[0xf].type,(Literal *)&ptrFlow);
      bytes = wasm::SIMDLoadStoreLane::getMemBytes();
      AVar3 = getFinalAddress<wasm::SIMDLoadStoreLane>
                        ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                         (Literal *)&lanes._M_elems[0xf].type,bytes,AVar3);
      wasm::Literal::~Literal((Literal *)&lanes._M_elems[0xf].type);
      if (ptrFlow.breakTo.super_IString.str._M_str +
          ((long)((long)vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >>
          3) * -0x5555555555555555 != (char *)0x1) goto LAB_0012e824;
      wasm::Literal::Literal
                ((Literal *)&vecFlow.breakTo.super_IString.str._M_str,(Literal *)&vecFlow);
      switch(*(undefined4 *)(curr + 0x10)) {
      case 0:
      case 4:
        wasm::Literal::getLanesUI8x16();
        cVar1 = wasm::SIMDLoadStoreLane::isStore();
        if (cVar1 == '\0') {
          iVar2 = (*(*(ExternalInterface **)((long)local_48 + 0x200))->_vptr_ExternalInterface[0xe])
                            (*(ExternalInterface **)((long)local_48 + 0x200),AVar3.addr,
                             info.instance,info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(vec.type.id._4_4_,iVar2) & 0xffffffff000000ff;
          wasm::Literal::operator=
                    ((Literal *)
                     ((long)&aLStack_468[0].field_0 + ((ulong)(byte)curr[0x28] + 0xf) * 0x18),
                     (Literal *)&vec.type);
          wasm::Literal::~Literal((Literal *)&vec.type);
          wasm::Literal::Literal(&local_168,(array *)local_300);
          Flow::Flow(__return_storage_ptr__,&local_168);
          wasm::Literal::~Literal(&local_168);
        }
        else {
          if (lanes._M_elems[(byte)curr[0x28]].field_0.func.super_IString.str._M_str != (char *)0x2)
          {
LAB_0012e843:
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x120,"int32_t wasm::Literal::geti32() const");
          }
          (*(*(ExternalInterface **)((long)local_48 + 0x200))->_vptr_ExternalInterface[0x16])
                    (*(ExternalInterface **)((long)local_48 + 0x200),AVar3.addr,
                     (ulong)(uint)(int)*(char *)((long)&aLStack_468[0].field_0 +
                                                ((ulong)(byte)curr[0x28] + 0xf) * 0x18),
                     info.instance,info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        lVar4 = 0x168;
        do {
          wasm::Literal::~Literal((Literal *)((long)&(&lanes)[-1]._M_elems[0xf].type.id + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        break;
      case 1:
      case 5:
        wasm::Literal::getLanesUI16x8();
        cVar1 = wasm::SIMDLoadStoreLane::isStore();
        if (cVar1 == '\0') {
          iVar2 = (*(*(ExternalInterface **)((long)local_48 + 0x200))->_vptr_ExternalInterface[0x10]
                  )(*(ExternalInterface **)((long)local_48 + 0x200),AVar3.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(vec.type.id._4_4_,iVar2) & 0xffffffff0000ffff;
          wasm::Literal::operator=
                    ((Literal *)
                     ((long)&aLStack_468[0].field_0 + ((ulong)(byte)curr[0x28] + 0xf) * 0x18),
                     (Literal *)&vec.type);
          wasm::Literal::~Literal((Literal *)&vec.type);
          wasm::Literal::Literal(&local_150,(array *)local_300);
          Flow::Flow(__return_storage_ptr__,&local_150);
          wasm::Literal::~Literal(&local_150);
        }
        else {
          if (lanes._M_elems[(byte)curr[0x28]].field_0.func.super_IString.str._M_str != (char *)0x2)
          goto LAB_0012e843;
          (*(*(ExternalInterface **)((long)local_48 + 0x200))->_vptr_ExternalInterface[0x17])
                    (*(ExternalInterface **)((long)local_48 + 0x200),AVar3.addr,
                     (ulong)(uint)(int)*(short *)((long)&aLStack_468[0].field_0 +
                                                 ((ulong)(byte)curr[0x28] + 0xf) * 0x18),
                     info.instance,info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        lVar4 = 0xa8;
        do {
          wasm::Literal::~Literal((Literal *)((long)&(&lanes)[-1]._M_elems[0xf].type.id + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        break;
      case 2:
      case 6:
        wasm::Literal::getLanesI32x4();
        cVar1 = wasm::SIMDLoadStoreLane::isStore();
        if (cVar1 == '\0') {
          iVar2 = (*(*(ExternalInterface **)((long)local_48 + 0x200))->_vptr_ExternalInterface[0x12]
                  )(*(ExternalInterface **)((long)local_48 + 0x200),AVar3.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id._0_4_ = iVar2;
          wasm::Literal::operator=
                    ((Literal *)
                     ((long)&aLStack_468[0].field_0 + ((ulong)(byte)curr[0x28] + 0xf) * 0x18),
                     (Literal *)&vec.type);
          wasm::Literal::~Literal((Literal *)&vec.type);
          wasm::Literal::Literal(&local_138,(array *)local_300);
          Flow::Flow(__return_storage_ptr__,&local_138);
          wasm::Literal::~Literal(&local_138);
        }
        else {
          if (lanes._M_elems[(byte)curr[0x28]].field_0.func.super_IString.str._M_str != (char *)0x2)
          goto LAB_0012e843;
          (*(*(ExternalInterface **)((long)local_48 + 0x200))->_vptr_ExternalInterface[0x18])
                    (*(ExternalInterface **)((long)local_48 + 0x200),AVar3.addr,
                     (ulong)*(uint *)((long)&aLStack_468[0].field_0 +
                                     ((ulong)(byte)curr[0x28] + 0xf) * 0x18),info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        lVar4 = 0x48;
        do {
          wasm::Literal::~Literal((Literal *)((long)&(&lanes)[-1]._M_elems[0xf].type.id + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        break;
      case 3:
      case 7:
        wasm::Literal::getLanesI64x2();
        cVar1 = wasm::SIMDLoadStoreLane::isStore();
        if (cVar1 == '\0') {
          iVar2 = (*(*(ExternalInterface **)((long)local_48 + 0x200))->_vptr_ExternalInterface[0x14]
                  )(*(ExternalInterface **)((long)local_48 + 0x200),AVar3.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(extraout_var,iVar2);
          wasm::Literal::operator=
                    ((Literal *)
                     ((long)&aLStack_468[0].field_0 + ((ulong)(byte)curr[0x28] + 0xf) * 0x18),
                     (Literal *)&vec.type);
          wasm::Literal::~Literal((Literal *)&vec.type);
          wasm::Literal::Literal(&local_120,(array *)local_300);
          Flow::Flow(__return_storage_ptr__,&local_120);
          wasm::Literal::~Literal(&local_120);
        }
        else {
          if (lanes._M_elems[(byte)curr[0x28]].field_0.func.super_IString.str._M_str != (char *)0x3)
          {
            __assert_fail("type == Type::i64",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                          ,0x129,"int64_t wasm::Literal::geti64() const");
          }
          (*(*(ExternalInterface **)((long)local_48 + 0x200))->_vptr_ExternalInterface[0x19])
                    (*(ExternalInterface **)((long)local_48 + 0x200),AVar3.addr,
                     *(undefined8 *)
                      ((long)&aLStack_468[0].field_0 + ((ulong)(byte)curr[0x28] + 0xf) * 0x18),
                     info.instance,info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        lVar4 = 0x18;
        do {
          wasm::Literal::~Literal((Literal *)((long)&(&lanes)[-1]._M_elems[0xf].type.id + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
        break;
      default:
        wasm::handle_unreachable
                  ("unexpected op",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xf91);
      }
      wasm::Literal::~Literal((Literal *)&vecFlow.breakTo.super_IString.str._M_str);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)ptrFlow.breakTo.super_IString.str._M_str;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&vecFlow);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)vecFlow.breakTo.super_IString.str._M_len;
    }
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
               &vecFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
    wasm::Literal::~Literal((Literal *)&vecFlow);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_108;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ptrFlow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ptrFlow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ptrFlow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&ptrFlow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    NOTE_ENTER("SIMDLoadStoreLane");
    Flow ptrFlow = self()->visit(curr->ptr);
    if (ptrFlow.breaking()) {
      return ptrFlow;
    }
    NOTE_EVAL1(ptrFlow);
    Flow vecFlow = self()->visit(curr->vec);
    if (vecFlow.breaking()) {
      return vecFlow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address addr = info.instance->getFinalAddress(
      curr, ptrFlow.getSingleValue(), curr->getMemBytes(), memorySize);
    Literal vec = vecFlow.getSingleValue();
    switch (curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128: {
        std::array<Literal, 16> lanes = vec.getLanesUI8x16();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load8u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store8(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load16LaneVec128:
      case Store16LaneVec128: {
        std::array<Literal, 8> lanes = vec.getLanesUI16x8();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load16u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store16(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load32LaneVec128:
      case Store32LaneVec128: {
        std::array<Literal, 4> lanes = vec.getLanesI32x4();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load32u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store32(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Store64LaneVec128:
      case Load64LaneVec128: {
        std::array<Literal, 2> lanes = vec.getLanesI64x2();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load64u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store64(
            addr, lanes[curr->index].geti64(), info.name);
          return {};
        }
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }